

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O1

OPJ_BYTE * opj_jp2_write_colr(opj_jp2_t *jp2,OPJ_UINT32 *p_nb_bytes_written)

{
  OPJ_UINT32 OVar1;
  OPJ_BYTE *p_buffer;
  uint p_value;
  ulong uVar2;
  
  if (jp2 == (opj_jp2_t *)0x0) {
    __assert_fail("jp2 != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                  ,0x330,"OPJ_BYTE *opj_jp2_write_colr(opj_jp2_t *, OPJ_UINT32 *)");
  }
  if (p_nb_bytes_written == (OPJ_UINT32 *)0x0) {
    __assert_fail("p_nb_bytes_written != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                  ,0x331,"OPJ_BYTE *opj_jp2_write_colr(opj_jp2_t *, OPJ_UINT32 *)");
  }
  OVar1 = jp2->meth;
  if (1 < OVar1 - 1) {
    __assert_fail("jp2->meth == 1 || jp2->meth == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                  ,0x332,"OPJ_BYTE *opj_jp2_write_colr(opj_jp2_t *, OPJ_UINT32 *)");
  }
  if (OVar1 == 1) {
    p_value = 0xf;
  }
  else {
    if (OVar1 != 2) {
      return (OPJ_BYTE *)0x0;
    }
    OVar1 = (jp2->color).icc_profile_len;
    if (OVar1 == 0) {
      __assert_fail("jp2->color.icc_profile_len",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                    ,0x339,"OPJ_BYTE *opj_jp2_write_colr(opj_jp2_t *, OPJ_UINT32 *)");
    }
    p_value = OVar1 + 0xb;
  }
  p_buffer = (OPJ_BYTE *)opj_calloc(1,(ulong)p_value);
  if (p_buffer == (OPJ_BYTE *)0x0) {
    return (OPJ_BYTE *)0x0;
  }
  opj_write_bytes_LE(p_buffer,p_value,4);
  opj_write_bytes_LE(p_buffer + 4,0x636f6c72,4);
  opj_write_bytes_LE(p_buffer + 8,jp2->meth,1);
  opj_write_bytes_LE(p_buffer + 9,jp2->precedence,1);
  opj_write_bytes_LE(p_buffer + 10,jp2->approx,1);
  if (jp2->meth == 1) {
    opj_write_bytes_LE(p_buffer + 0xb,jp2->enumcs,4);
  }
  else if ((jp2->meth == 2) && ((jp2->color).icc_profile_len != 0)) {
    uVar2 = 0;
    do {
      opj_write_bytes_LE(p_buffer + 0xb + uVar2,(uint)(jp2->color).icc_profile_buf[uVar2],1);
      uVar2 = uVar2 + 1;
    } while (uVar2 < (jp2->color).icc_profile_len);
  }
  *p_nb_bytes_written = p_value;
  return p_buffer;
}

Assistant:

static OPJ_BYTE * opj_jp2_write_colr(opj_jp2_t *jp2,
                                     OPJ_UINT32 * p_nb_bytes_written
                                    )
{
    /* room for 8 bytes for box 3 for common data and variable upon profile*/
    OPJ_UINT32 l_colr_size = 11;
    OPJ_BYTE * l_colr_data, * l_current_colr_ptr;

    /* preconditions */
    assert(jp2 != 00);
    assert(p_nb_bytes_written != 00);
    assert(jp2->meth == 1 || jp2->meth == 2);

    switch (jp2->meth) {
    case 1 :
        l_colr_size += 4; /* EnumCS */
        break;
    case 2 :
        assert(jp2->color.icc_profile_len); /* ICC profile */
        l_colr_size += jp2->color.icc_profile_len;
        break;
    default :
        return 00;
    }

    l_colr_data = (OPJ_BYTE *) opj_calloc(1, l_colr_size);
    if (l_colr_data == 00) {
        return 00;
    }

    l_current_colr_ptr = l_colr_data;

    opj_write_bytes(l_current_colr_ptr, l_colr_size,
                    4);            /* write box size */
    l_current_colr_ptr += 4;

    opj_write_bytes(l_current_colr_ptr, JP2_COLR, 4);               /* BPCC */
    l_current_colr_ptr += 4;

    opj_write_bytes(l_current_colr_ptr, jp2->meth, 1);              /* METH */
    ++l_current_colr_ptr;

    opj_write_bytes(l_current_colr_ptr, jp2->precedence, 1);        /* PRECEDENCE */
    ++l_current_colr_ptr;

    opj_write_bytes(l_current_colr_ptr, jp2->approx, 1);            /* APPROX */
    ++l_current_colr_ptr;

    if (jp2->meth ==
            1) { /* Meth value is restricted to 1 or 2 (Table I.9 of part 1) */
        opj_write_bytes(l_current_colr_ptr, jp2->enumcs, 4);
    }       /* EnumCS */
    else {
        if (jp2->meth == 2) {                                      /* ICC profile */
            OPJ_UINT32 i;
            for (i = 0; i < jp2->color.icc_profile_len; ++i) {
                opj_write_bytes(l_current_colr_ptr, jp2->color.icc_profile_buf[i], 1);
                ++l_current_colr_ptr;
            }
        }
    }

    *p_nb_bytes_written = l_colr_size;

    return l_colr_data;
}